

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

bool IsActorAnItem(AActor *mo)

{
  bool bVar1;
  
  bVar1 = DObject::IsKindOf((DObject *)mo,AInventory::RegistrationInfo.MyClass);
  if (bVar1) {
    bVar1 = (bool)((byte)(mo->flags).Value & 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool IsActorAnItem(AActor *mo)
{
	return mo->IsKindOf(RUNTIME_CLASS(AInventory)) && mo->flags&MF_SPECIAL;
}